

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector.h
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
gmath::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,SVector<double,_6> *a)

{
  int i;
  long lVar1;
  
  std::operator<<(out,"[");
  std::ostream::_M_insert<double>(a->v[0]);
  for (lVar1 = 1; lVar1 != 6; lVar1 = lVar1 + 1) {
    std::operator<<(out," ");
    std::ostream::_M_insert<double>(a->v[lVar1]);
  }
  std::operator<<(out,"]");
  return out;
}

Assistant:

std::basic_ostream<Ch, Tr> &operator<<(std::basic_ostream<Ch, Tr> &out, const SVector<T, n> &a)
{
  out << "[" << a[0];

  for (int i=1; i<n; i++)
  {
    out << " " << a[i];
  }

  out << "]";

  return out;
}